

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void flat_mask_internal(__m128i *th,__m128i *pq,int start,int end,__m128i *flat)

{
  __m128i alVar1;
  short sVar2;
  ulong uVar3;
  __m128i *palVar4;
  ushort uVar5;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar7 [16];
  ushort uVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar6;
  short sVar15;
  
  alVar1 = *pq;
  auVar7 = psubusw((undefined1  [16])alVar1,(undefined1  [16])pq[(uint)start]);
  auVar16 = psubusw((undefined1  [16])pq[(uint)start],(undefined1  [16])alVar1);
  auVar16 = auVar16 | auVar7;
  auVar17 = psubusw((undefined1  [16])alVar1,(undefined1  [16])pq[(long)start + 1]);
  auVar7 = psubusw((undefined1  [16])pq[(long)start + 1],(undefined1  [16])alVar1);
  auVar7 = auVar7 | auVar17;
  sVar2 = auVar16._0_2_;
  sVar6 = auVar7._0_2_;
  uVar5 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._2_2_;
  sVar6 = auVar7._2_2_;
  uVar8 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._4_2_;
  sVar6 = auVar7._4_2_;
  uVar9 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._6_2_;
  sVar6 = auVar7._6_2_;
  uVar10 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._8_2_;
  sVar6 = auVar7._8_2_;
  uVar11 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._10_2_;
  sVar6 = auVar7._10_2_;
  uVar12 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._12_2_;
  sVar6 = auVar7._12_2_;
  sVar15 = auVar7._14_2_;
  uVar13 = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar2 = auVar16._14_2_;
  uVar14 = (ushort)(sVar15 < sVar2) * sVar2 | (ushort)(sVar15 >= sVar2) * sVar15;
  uVar3 = (ulong)(start + 2);
  palVar4 = pq + uVar3;
  for (; (int)uVar3 < end; uVar3 = (ulong)((int)uVar3 + 1)) {
    auVar16 = psubusw((undefined1  [16])alVar1,(undefined1  [16])*palVar4);
    auVar7 = psubusw((undefined1  [16])*palVar4,(undefined1  [16])alVar1);
    auVar7 = auVar7 | auVar16;
    sVar2 = auVar7._0_2_;
    uVar5 = (ushort)((short)uVar5 < sVar2) * sVar2 | ((short)uVar5 >= sVar2) * uVar5;
    sVar2 = auVar7._2_2_;
    uVar8 = (ushort)((short)uVar8 < sVar2) * sVar2 | ((short)uVar8 >= sVar2) * uVar8;
    sVar2 = auVar7._4_2_;
    uVar9 = (ushort)((short)uVar9 < sVar2) * sVar2 | ((short)uVar9 >= sVar2) * uVar9;
    sVar2 = auVar7._6_2_;
    uVar10 = (ushort)((short)uVar10 < sVar2) * sVar2 | ((short)uVar10 >= sVar2) * uVar10;
    sVar2 = auVar7._8_2_;
    uVar11 = (ushort)((short)uVar11 < sVar2) * sVar2 | ((short)uVar11 >= sVar2) * uVar11;
    sVar2 = auVar7._10_2_;
    uVar12 = (ushort)((short)uVar12 < sVar2) * sVar2 | ((short)uVar12 >= sVar2) * uVar12;
    sVar2 = auVar7._12_2_;
    uVar13 = (ushort)((short)uVar13 < sVar2) * sVar2 | ((short)uVar13 >= sVar2) * uVar13;
    sVar2 = auVar7._14_2_;
    uVar14 = (ushort)((short)uVar14 < sVar2) * sVar2 | ((short)uVar14 >= sVar2) * uVar14;
    palVar4 = palVar4 + 1;
  }
  auVar7._0_2_ = ((short)uVar11 < (short)uVar5) * uVar5 | ((short)uVar11 >= (short)uVar5) * uVar11;
  auVar7._2_2_ = ((short)uVar12 < (short)uVar8) * uVar8 | ((short)uVar12 >= (short)uVar8) * uVar12;
  auVar7._4_2_ = ((short)uVar13 < (short)uVar9) * uVar9 | ((short)uVar13 >= (short)uVar9) * uVar13;
  auVar7._6_2_ = ((short)uVar14 < (short)uVar10) * uVar10 |
                 ((short)uVar14 >= (short)uVar10) * uVar14;
  auVar7._8_2_ = (0 < (short)uVar11) * uVar11;
  auVar7._10_2_ = (0 < (short)uVar12) * uVar12;
  auVar7._12_2_ = (0 < (short)uVar13) * uVar13;
  auVar7._14_2_ = (0 < (short)uVar14) * uVar14;
  auVar7 = psubusw(auVar7,(undefined1  [16])*th);
  *(ushort *)*flat = -(ushort)(auVar7._0_2_ == 0);
  *(ushort *)((long)*flat + 2) = -(ushort)(auVar7._2_2_ == 0);
  *(ushort *)((long)*flat + 4) = -(ushort)(auVar7._4_2_ == 0);
  *(ushort *)((long)*flat + 6) = -(ushort)(auVar7._6_2_ == 0);
  *(ushort *)(*flat + 1) = -(ushort)(auVar7._8_2_ == 0);
  *(ushort *)((long)*flat + 10) = -(ushort)(auVar7._10_2_ == 0);
  *(ushort *)((long)*flat + 0xc) = -(ushort)(auVar7._12_2_ == 0);
  *(ushort *)((long)*flat + 0xe) = -(ushort)(auVar7._14_2_ == 0);
  return;
}

Assistant:

static inline void flat_mask_internal(const __m128i *th, const __m128i *pq,
                                      int start, int end, __m128i *flat) {
  int i;
  __m128i max = _mm_max_epi16(abs_diff16(pq[start], pq[0]),
                              abs_diff16(pq[start + 1], pq[0]));

  for (i = start + 2; i < end; ++i) {
    max = _mm_max_epi16(max, abs_diff16(pq[i], pq[0]));
  }
  max = _mm_max_epi16(max, _mm_srli_si128(max, 8));

  __m128i ft;
  ft = _mm_subs_epu16(max, *th);

  const __m128i zero = _mm_setzero_si128();
  *flat = _mm_cmpeq_epi16(ft, zero);
}